

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.cpp
# Opt level: O2

void __thiscall
FactoredDecPOMDPDiscrete::~FactoredDecPOMDPDiscrete(FactoredDecPOMDPDiscrete *this,void **vtt)

{
  void *pvVar1;
  reference ppRVar2;
  uint uVar3;
  
  pvVar1 = *vtt;
  *(void **)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
             super_MultiAgentDecisionProcess = pvVar1;
  *(void **)(&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
              super_MultiAgentDecisionProcess.field_0x0 + *(long *)((long)pvVar1 + -0x58)) =
       vtt[0xb];
  *(void **)(&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
              super_MultiAgentDecisionProcess.field_0x0 +
            *(long *)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                super_MultiAgentDecisionProcess + -0x60)) = vtt[0xc];
  *(void **)(&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
              super_MultiAgentDecisionProcess.field_0x0 +
            *(long *)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                super_MultiAgentDecisionProcess + -0x68)) = vtt[0xd];
  *(void **)(&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
              super_MultiAgentDecisionProcess.field_0x0 +
            *(long *)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                super_MultiAgentDecisionProcess + -0x70)) = vtt[0xe];
  *(void **)(&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
              super_MultiAgentDecisionProcess.field_0x0 +
            *(long *)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                super_MultiAgentDecisionProcess + -0x40)) = vtt[0xf];
  *(void **)(&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
              super_MultiAgentDecisionProcess.field_0x0 +
            *(long *)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                super_MultiAgentDecisionProcess + -0x50)) = vtt[0x10];
  *(void **)(&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
              super_MultiAgentDecisionProcess.field_0x0 +
            *(long *)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                super_MultiAgentDecisionProcess + -0x48)) = vtt[0x11];
  *(void **)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).field_0x600 = vtt[0x12];
  for (uVar3 = 0;
      (long)(this->_m_LRFs).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(this->_m_LRFs).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>.
            _M_impl.super__Vector_impl_data._M_start >> 3 != (ulong)uVar3; uVar3 = uVar3 + 1) {
    ppRVar2 = std::vector<RewardModel_*,_std::allocator<RewardModel_*>_>::at
                        (&this->_m_LRFs,(ulong)uVar3);
    if (*ppRVar2 != (value_type)0x0) {
      (*((*ppRVar2)->super_RewardModelDiscreteInterface).super_QTableInterface._vptr_QTableInterface
        [3])();
    }
  }
  if (this->_m_p_rModel != (RewardModel *)0x0) {
    (*(this->_m_p_rModel->super_RewardModelDiscreteInterface).super_QTableInterface.
      _vptr_QTableInterface[3])();
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&this->_m_nrActionVals);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&this->_m_nrSFVals);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->_m_nrAIs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->_m_nrXIs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  FactoredQFunctionScopeForStage::~FactoredQFunctionScopeForStage(&this->_m_immRewScope);
  std::_Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>::~_Vector_base
            (&(this->_m_LRFs).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&this->_m_agScopes);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&this->_m_sfScopes);
  MultiAgentDecisionProcessDiscreteFactoredStates::~MultiAgentDecisionProcessDiscreteFactoredStates
            (&this->super_MultiAgentDecisionProcessDiscreteFactoredStates,vtt + 1);
  return;
}

Assistant:

FactoredDecPOMDPDiscrete::~FactoredDecPOMDPDiscrete()
{
    for(Index i=0;i!=_m_LRFs.size();++i)
        delete _m_LRFs.at(i);
    delete _m_p_rModel;
}